

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

int codebook_decode_start(vorb *f,Codebook *c)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  
  if (c->lookup_type == '\0') {
    iVar3 = -1;
  }
  else {
    if (f->valid_bits < 10) {
      if (f->valid_bits == 0) {
        f->acc = 0;
      }
      do {
        if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
           (iVar3 = get8_packet_raw(f), iVar3 == -1)) break;
        iVar4 = f->valid_bits;
        f->acc = f->acc + (iVar3 << ((byte)iVar4 & 0x1f));
        f->valid_bits = iVar4 + 8;
      } while (iVar4 < 0x11);
    }
    sVar2 = c->fast_huffman[f->acc & 0x3ff];
    if (sVar2 < 0) {
      iVar3 = codebook_decode_scalar_raw(f,c);
      if (-1 < iVar3) {
        return iVar3;
      }
    }
    else {
      bVar1 = c->codeword_lengths[(int)sVar2];
      f->acc = f->acc >> (bVar1 & 0x1f);
      iVar4 = f->valid_bits - (uint)bVar1;
      iVar3 = 0;
      if (0 < iVar4) {
        iVar3 = iVar4;
      }
      f->valid_bits = iVar3;
      if (-1 < iVar4) {
        return (int)sVar2;
      }
      iVar3 = -1;
    }
    if ((f->bytes_in_seg == '\0') && (f->last_seg != 0)) {
      return iVar3;
    }
  }
  f->error = VORBIS_invalid_stream;
  return iVar3;
}

Assistant:

static int codebook_decode_start(vorb *f, Codebook *c)
{
   int z = -1;

   // type 0 is only legal in a scalar context
   if (c->lookup_type == 0)
      error(f, VORBIS_invalid_stream);
   else {
      DECODE_VQ(z,f,c);
      if (c->sparse) assert(z < c->sorted_entries);
      if (z < 0) {  // check for EOP
         if (!f->bytes_in_seg)
            if (f->last_seg)
               return z;
         error(f, VORBIS_invalid_stream);
      }
   }
   return z;
}